

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void bitmap_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Style ls;
  Am_Image_Array image;
  Am_Style fs;
  
  pAVar4 = Am_Object::Get(self,0xb0,0);
  Am_Image_Array::Am_Image_Array(&image,pAVar4);
  bVar1 = Am_Image_Array::Valid(&image);
  if (bVar1) {
    pAVar4 = Am_Object::Get(self,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(self,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(self,0x6b,0);
    Am_Style::Am_Style(&ls,pAVar4);
    pAVar4 = Am_Object::Get(self,0x6a,0);
    Am_Style::Am_Style(&fs,pAVar4);
    pAVar4 = Am_Object::Get(self,0xb1,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    (*drawonable->_vptr_Am_Drawonable[0x27])
              (drawonable,(ulong)(uint)(iVar2 + x_offset),(ulong)(uint)(iVar3 + y_offset),0xffffffff
               ,0xffffffff,&image,0,0,&ls,&fs,(ulong)bVar1,0);
    Am_Style::~Am_Style(&fs);
    Am_Style::~Am_Style(&ls);
  }
  Am_Image_Array::~Am_Image_Array(&image);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, bitmap_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  Am_Image_Array image = self.Get(Am_IMAGE);
  if (image.Valid()) {
    int left = (int)self.Get(Am_LEFT) + x_offset;
    int top = (int)self.Get(Am_TOP) + y_offset;
    Am_Style ls = self.Get(Am_LINE_STYLE);
    Am_Style fs = self.Get(Am_FILL_STYLE);
    bool monochrome = self.Get(Am_DRAW_MONOCHROME);
    drawonable->Draw_Image(left, top, -1, -1, image, 0, 0, ls, fs, monochrome);
  }
}